

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::compute_rho(Epnp *this,Matrix<double,_6,_1,_0,_6,_1> *Rho)

{
  Scalar *pSVar1;
  Epnp *in_RDI;
  double index;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *this_00;
  double dVar2;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *in_stack_ffffffffffffffc0;
  
  index = dist2(in_RDI,in_RDI->cws[0],in_RDI->cws[1]);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (in_stack_ffffffffffffffc0,(Index)index);
  *pSVar1 = index;
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
            dist2(in_RDI,in_RDI->cws[0],in_RDI->cws[2]);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (this_00,(Index)index);
  *pSVar1 = (Scalar)this_00;
  dVar2 = dist2(in_RDI,in_RDI->cws[0],in_RDI->cws[3]);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (this_00,(Index)index);
  *pSVar1 = dVar2;
  dVar2 = dist2(in_RDI,in_RDI->cws[1],in_RDI->cws[2]);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (this_00,(Index)index);
  *pSVar1 = dVar2;
  dVar2 = dist2(in_RDI,in_RDI->cws[1],in_RDI->cws[3]);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (this_00,(Index)index);
  *pSVar1 = dVar2;
  dVar2 = dist2(in_RDI,in_RDI->cws[2],in_RDI->cws[3]);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (this_00,(Index)index);
  *pSVar1 = dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::compute_rho(
    Eigen::Matrix<double,6,1> & Rho)
{
  Rho[0] = dist2(cws[0], cws[1]);
  Rho[1] = dist2(cws[0], cws[2]);
  Rho[2] = dist2(cws[0], cws[3]);
  Rho[3] = dist2(cws[1], cws[2]);
  Rho[4] = dist2(cws[1], cws[3]);
  Rho[5] = dist2(cws[2], cws[3]);
}